

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nearest_neighbor.cc
# Opt level: O1

void __thiscall
features::NearestNeighbor<unsigned_short>::find
          (NearestNeighbor<unsigned_short> *this,unsigned_short *query,Result *result)

{
  int iVar1;
  int iVar2;
  unsigned_short *puVar3;
  short *psVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  
  result->index_2nd_best = 0;
  result->dist_1st_best = 0;
  result->dist_2nd_best = 0;
  result->index_1st_best = 0;
  iVar1 = *(int *)this;
  iVar2 = *(int *)(this + 4);
  iVar5 = iVar1 + 7;
  if (-1 < iVar1) {
    iVar5 = iVar1;
  }
  if (0 < iVar2) {
    psVar4 = *(short **)(this + 8);
    uVar7 = 0;
    iVar6 = 0;
    do {
      uVar10 = 0;
      uVar11 = 0;
      uVar12 = 0;
      uVar13 = 0;
      uVar14 = 0;
      uVar15 = 0;
      uVar16 = 0;
      uVar17 = 0;
      puVar3 = query;
      iVar8 = iVar5 >> 3;
      if (7 < iVar1) {
        do {
          uVar10 = uVar10 + *psVar4 * *puVar3;
          uVar11 = uVar11 + psVar4[1] * puVar3[1];
          uVar12 = uVar12 + psVar4[2] * puVar3[2];
          uVar13 = uVar13 + psVar4[3] * puVar3[3];
          uVar14 = uVar14 + psVar4[4] * puVar3[4];
          uVar15 = uVar15 + psVar4[5] * puVar3[5];
          uVar16 = uVar16 + psVar4[6] * puVar3[6];
          uVar17 = uVar17 + psVar4[7] * puVar3[7];
          psVar4 = psVar4 + 8;
          iVar8 = iVar8 + -1;
          puVar3 = puVar3 + 8;
        } while (iVar8 != 0);
      }
      uVar9 = (uint)uVar17 +
              (uint)uVar16 + (uint)uVar15 + (uint)uVar14 +
              (uint)uVar13 + (uint)uVar12 + (uint)uVar11 + (uint)uVar10;
      if ((uVar7 & 0xffff) <= uVar9) {
        uVar7 = (uint)result->dist_1st_best;
        if (uVar9 < uVar7) {
          result->index_2nd_best = iVar6;
          result->dist_2nd_best = (unsigned_short)uVar9;
          uVar7 = uVar9;
        }
        else {
          result->index_2nd_best = result->index_1st_best;
          result->dist_2nd_best = result->dist_1st_best;
          result->index_1st_best = iVar6;
          result->dist_1st_best = (unsigned_short)uVar9;
        }
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 != iVar2);
  }
  uVar10 = 0xfe01;
  if (result->dist_1st_best < 0xfe01) {
    uVar10 = result->dist_1st_best;
  }
  uVar10 = 0xfe01 - uVar10;
  uVar11 = -result->dist_2nd_best - 0x1ff;
  if (0xfe01 < result->dist_2nd_best) {
    uVar11 = 0;
  }
  if (0x7ffe < uVar10) {
    uVar10 = 0x7fff;
  }
  result->dist_1st_best = uVar10 * 2;
  if (0x7ffe < uVar11) {
    uVar11 = 0x7fff;
  }
  result->dist_2nd_best = uVar11 * 2;
  return;
}

Assistant:

void
NearestNeighbor<unsigned short>::find (unsigned short const* query,
    NearestNeighbor<unsigned short>::Result* result) const
{
    /* Result distances are shamelessly misused to store inner products. */
    result->dist_1st_best = 0;
    result->dist_2nd_best = 0;
    result->index_1st_best = 0;
    result->index_2nd_best = 0;

    short_inner_prod<unsigned short>(query, result, this->elements,
        this->num_elements, this->dimensions);

    /*
     * Compute actual square distances.
     * The distance with 'unsigned char' vectors is: 2 * 255^2 - 2 * <Q, Ci>.
     * The maximum distance is (2*255)^2, which unfortunately does not fit
     * in a unsigned short. Therefore, the result distance is clapmed:
     * 2 * 255^2 - 2 * <Q, Ci> = 2 * (255^2 - <Q, Ci>) and (255^2 - <Q, Ci>)
     * is clamped to 32767 and then multiplied by 2.
     */
    result->dist_1st_best = std::min(65025, (int)result->dist_1st_best);
    result->dist_2nd_best = std::min(65025, (int)result->dist_2nd_best);
    result->dist_1st_best = 65025 - result->dist_1st_best;
    result->dist_2nd_best = 65025 - result->dist_2nd_best;
    result->dist_1st_best = std::min(32767, (int)result->dist_1st_best) * 2;
    result->dist_2nd_best = std::min(32767, (int)result->dist_2nd_best) * 2;
}